

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::generateArray
                 (int seed,GLValue min,GLValue max,int count,int componentCount,int stride,
                 InputType type)

{
  int iVar1;
  GLValue max_00;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  GLValue min_00;
  deRandom rnd;
  int local_88;
  undefined4 uStack_4c;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  if (stride == 0) {
    stride = Array::inputTypeSize::size[(int)type] * componentCount;
  }
  pcVar3 = (char *)operator_new__((long)(stride * count));
  if (0 < count) {
    local_88 = 0;
    iVar2 = 0;
    do {
      if (0 < componentCount) {
        piVar4 = Array::inputTypeSize::size;
        iVar1 = Array::inputTypeSize::size[(int)type];
        uVar5 = (ulong)(uint)componentCount;
        iVar6 = local_88;
        do {
          max_00._4_4_ = uStack_4c;
          max_00.type = max.type;
          max_00.field_1 = max.field_1;
          min_00.field_1 = min.field_1;
          min_00._0_8_ = piVar4;
          setData(pcVar3 + iVar6,type,&local_40,min_00,max_00);
          iVar6 = iVar6 + iVar1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      iVar2 = iVar2 + 1;
      local_88 = local_88 + stride;
    } while (iVar2 != count);
  }
  return pcVar3;
}

Assistant:

char* RandomArrayGenerator::generateArray (int seed, GLValue min, GLValue max, int count, int componentCount, int stride, Array::InputType type)
{
	char* data = NULL;

	deRandom rnd;
	deRandom_init(&rnd, seed);

	if (stride == 0)
		stride = componentCount * Array::inputTypeSize(type);

	data = new char[stride * count];

	for (int vertexNdx = 0; vertexNdx < count; vertexNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			setData(&(data[vertexNdx * stride + Array::inputTypeSize(type) * componentNdx]), type, rnd, min, max);
		}
	}

	return data;
}